

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::SerializeVars(FBehavior *this,FSerializer *arc)

{
  bool bVar1;
  int local_1c;
  int i;
  FSerializer *arc_local;
  FBehavior *this_local;
  
  bVar1 = FSerializer::BeginArray(arc,"variables");
  if (bVar1) {
    SerializeVarSet(this,arc,this->MapVarStore,0x80);
    for (local_1c = 0; local_1c < this->NumArrays; local_1c = local_1c + 1) {
      SerializeVarSet(this,arc,this->ArrayStore[local_1c].Elements,
                      this->ArrayStore[local_1c].ArraySize);
    }
    FSerializer::EndArray(arc);
  }
  return;
}

Assistant:

void FBehavior::SerializeVars (FSerializer &arc)
{
	if (arc.BeginArray("variables"))
	{
		SerializeVarSet(arc, MapVarStore, NUM_MAPVARS);
		for (int i = 0; i < NumArrays; ++i)
		{
			SerializeVarSet(arc, ArrayStore[i].Elements, ArrayStore[i].ArraySize);
		}
		arc.EndArray();
	}
}